

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  pointer pRVar2;
  pointer pbVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  ostream *poVar8;
  uint uVar9;
  int iVar10;
  RegularExpression *rx;
  pointer pRVar11;
  string line;
  string input;
  ostringstream cmCTestLog_msg;
  long *local_208;
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  uVar9 = 0;
  if (this->UseCTestLaunch == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,data,(allocator<char> *)local_1a8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    cmStringReplaceHelper::Replace(this->ColorRemover,&local_1c8,&local_1e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Line: [",7);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x477,(char *)local_208,(this->super_cmCTestGenericHandler).Quiet);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar4 = true;
    if (this->ErrorQuotaReached == false) {
      pRVar11 = (this->ErrorMatchRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->ErrorMatchRegex).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = false;
      if (pRVar11 != pRVar2) {
        iVar10 = 0;
        do {
          bVar6 = cmsys::RegularExpression::find
                            (pRVar11,local_1e8._M_dataplus._M_p,&pRVar11->regmatch);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Error Line: ",0xe);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (matches: ",0xb);
            pbVar3 = (this->CustomErrorMatches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,pbVar3[iVar10]._M_dataplus._M_p,
                                pbVar3[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x488,(char *)local_208,(this->super_cmCTestGenericHandler).Quiet);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar4 = true;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar6 && pRVar11 != pRVar2);
      }
      pRVar11 = (this->ErrorExceptionRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->ErrorExceptionRegex).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar11 != pRVar2) {
        iVar10 = 0;
        do {
          bVar6 = cmsys::RegularExpression::find
                            (pRVar11,local_1e8._M_dataplus._M_p,&pRVar11->regmatch);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Not an error Line: ",0x15);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (matches: ",0xb);
            pbVar3 = (this->CustomErrorExceptions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,pbVar3[iVar10]._M_dataplus._M_p,
                                pbVar3[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x497,(char *)local_208,(this->super_cmCTestGenericHandler).Quiet);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar4 = false;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar6 && pRVar11 != pRVar2);
      }
      bVar4 = !bVar4;
    }
    uVar7 = 0;
    if (this->WarningQuotaReached == false) {
      pRVar11 = (this->WarningMatchRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->WarningMatchRegex).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = 0;
      if (pRVar11 != pRVar2) {
        iVar10 = 0;
        do {
          bVar6 = cmsys::RegularExpression::find
                            (pRVar11,local_1e8._M_dataplus._M_p,&pRVar11->regmatch);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Warning Line: ",0x10);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (matches: ",0xb);
            pbVar3 = (this->CustomWarningMatches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,pbVar3[iVar10]._M_dataplus._M_p,
                                pbVar3[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x4a8,(char *)local_208,(this->super_cmCTestGenericHandler).Quiet);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar5 = 1;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar6 && pRVar11 != pRVar2);
      }
      pRVar11 = (this->WarningExceptionRegex).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->WarningExceptionRegex).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar11 != pRVar2) {
        iVar10 = 0;
        do {
          bVar6 = cmsys::RegularExpression::find
                            (pRVar11,local_1e8._M_dataplus._M_p,&pRVar11->regmatch);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"  Not a warning Line: ",0x16);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (matches: ",0xb);
            pbVar3 = (this->CustomWarningExceptions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,pbVar3[iVar10]._M_dataplus._M_p,
                                pbVar3[iVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x4b8,(char *)local_208,(this->super_cmCTestGenericHandler).Quiet);
            if (local_208 != local_1f8) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar5 = 0;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          pRVar11 = pRVar11 + 1;
        } while (!bVar6 && pRVar11 != pRVar2);
      }
      uVar7 = (uint)bVar5;
    }
    uVar9 = 2;
    if (bVar4) {
      uVar9 = uVar7;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar9;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  // Ignore ANSI color codes when checking for errors and warnings.
  std::string input(data);
  std::string line;
  this->ColorRemover->Replace(input, line);

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << line << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << line << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << line << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}